

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  LodePNGDecoderSettings *zlibsettings;
  byte *pbVar1;
  LodePNGInfo *info;
  LodePNGColorMode *pLVar2;
  LodePNGColorMode *b;
  uint *data;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var3;
  bool bVar4;
  bool bVar5;
  uchar **ppuVar6;
  uchar uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uchar *puVar11;
  size_t sVar12;
  uchar *out_00;
  uint uVar13;
  ulong insize_00;
  uint uVar14;
  uint *chunk;
  long lVar15;
  ulong uVar16;
  size_t newsize;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  uchar *local_a8;
  ulong local_80;
  uchar *local_78;
  size_t sStack_70;
  ulong local_68;
  undefined8 local_58;
  uint *local_50;
  uchar **local_48;
  size_t *local_40;
  uchar **local_38;
  
  *out = (uchar *)0x0;
  *out = (uchar *)0x0;
  local_48 = out;
  uVar8 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar8;
  if (uVar8 == 0) {
    lVar15 = (ulong)*h * (ulong)*w;
    if (((*h == 0) || ((int)((ulong)lVar15 >> 0x20) == 0)) && ((uint)lVar15 < 0x10000000)) {
      chunk = (uint *)(in + 0x21);
      pLVar2 = &(state->info_png).color;
      info = &state->info_png;
      zlibsettings = &state->decoder;
      local_38 = (state->info_png).unknown_chunks_data;
      local_40 = (state->info_png).unknown_chunks_size;
      local_a8 = (uchar *)0x0;
      local_58 = 1;
      insize_00 = 0;
      local_80 = 0;
      bVar4 = false;
      bVar19 = false;
      local_50 = w;
      do {
        if ((bVar19) || (state->error != 0)) break;
        pbVar1 = (byte *)((long)chunk + (0xc - (long)in));
        if (insize < pbVar1 || chunk < in) {
          state->error = 0x1e;
LAB_001b41b4:
          iVar9 = 3;
          bVar19 = false;
        }
        else {
          uVar8 = (uint)(byte)*chunk << 0x18;
          if ((int)uVar8 < 0) {
            state->error = 0x3f;
            goto LAB_001b41b4;
          }
          uVar16 = (ulong)((uint)*(byte *)((long)chunk + 3) |
                           (uint)*(byte *)((long)chunk + 1) << 0x10 |
                           (uint)*(byte *)((long)chunk + 2) << 8 | uVar8);
          if ((insize < pbVar1 + uVar16) || ((byte *)((long)chunk + uVar16 + 0xc) < in)) {
            state->error = 0x40;
            goto LAB_001b41b4;
          }
          data = chunk + 2;
          uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"IDAT");
          if (uVar7 == '\0') {
            uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"IEND");
            if (uVar7 != '\0') {
              bVar19 = true;
              bVar5 = false;
              goto LAB_001b42a1;
            }
            uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"PLTE");
            if (uVar7 == '\0') {
              uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"tRNS");
              if (uVar7 == '\0') {
                uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"bKGD");
                if (uVar7 == '\0') {
                  uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"tEXt");
                  if (uVar7 == '\0') {
                    uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"zTXt");
                    if (uVar7 != '\0') {
                      if ((state->decoder).read_text_chunks == 0) goto LAB_001b43f9;
                      uVar8 = readChunk_zTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar16);
                      goto LAB_001b43d0;
                    }
                    uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"iTXt");
                    if (uVar7 == '\0') {
                      uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"tIME");
                      if (uVar7 == '\0') {
                        uVar7 = lodepng_chunk_type_equals((uchar *)chunk,"pHYs");
                        if (uVar7 == '\0') {
                          if ((chunk[1] & 0x20) == 0) {
                            state->error = 0x45;
                            goto LAB_001b435b;
                          }
                          if ((state->decoder).remember_unknown_chunks == 0) {
                            bVar4 = true;
                            goto LAB_001b4516;
                          }
                          uVar8 = (int)local_58 - 1;
                          uVar8 = lodepng_chunk_append
                                            (local_38 + uVar8,local_40 + uVar8,(uchar *)chunk);
                          state->error = uVar8;
                          bVar4 = true;
                          goto joined_r0x001b4450;
                        }
                        uVar8 = readChunk_pHYs(info,(uchar *)data,uVar16);
                      }
                      else {
                        uVar8 = readChunk_tIME(info,(uchar *)data,uVar16);
                      }
                      goto LAB_001b434a;
                    }
                    if ((state->decoder).read_text_chunks == 0) {
LAB_001b4516:
                      bVar19 = false;
                      bVar5 = true;
                      goto LAB_001b42a1;
                    }
                    uVar8 = readChunk_iTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar16);
                    state->error = uVar8;
                  }
                  else {
                    if ((state->decoder).read_text_chunks == 0) {
LAB_001b43f9:
                      bVar5 = true;
                      bVar19 = false;
                      goto LAB_001b42a1;
                    }
                    uVar8 = readChunk_tEXt(info,(uchar *)data,uVar16);
LAB_001b43d0:
                    state->error = uVar8;
                  }
joined_r0x001b4450:
                  bVar5 = true;
                  bVar19 = false;
                  iVar9 = 3;
                  if (uVar8 == 0) goto LAB_001b42a1;
                  goto LAB_001b41bb;
                }
                uVar8 = readChunk_bKGD(info,(uchar *)data,uVar16);
              }
              else {
                uVar8 = readChunk_tRNS(pLVar2,(uchar *)data,uVar16);
              }
LAB_001b434a:
              state->error = uVar8;
              bVar19 = false;
              if (uVar8 == 0) {
                bVar5 = true;
                goto LAB_001b42a1;
              }
            }
            else {
              uVar8 = readChunk_PLTE(pLVar2,(uchar *)data,uVar16);
              state->error = uVar8;
              bVar19 = false;
              if (uVar8 == 0) {
                bVar5 = true;
                local_58 = 2;
                goto LAB_001b42a1;
              }
            }
LAB_001b435b:
            bVar19 = false;
            iVar9 = 3;
          }
          else {
            uVar17 = insize_00 + uVar16;
            if (local_80 < uVar17) {
              uVar10 = uVar17 * 3 >> 1;
              if (local_80 * 2 < uVar17) {
                uVar10 = uVar17;
              }
              puVar11 = (uchar *)realloc(local_a8,uVar10);
              bVar18 = puVar11 == (uchar *)0x0;
              if (!bVar18) {
                local_80 = uVar10;
                local_a8 = puVar11;
              }
            }
            else {
              bVar18 = false;
            }
            if (bVar18) {
              state->error = 0x53;
              iVar9 = 3;
              uVar17 = insize_00;
            }
            else {
              iVar9 = 0;
              local_58 = 3;
              if (uVar16 != 0) {
                uVar10 = 0;
                do {
                  local_a8[uVar10 + insize_00] = *(byte *)((long)data + uVar10);
                  uVar10 = uVar10 + 1;
                } while (uVar16 != uVar10);
              }
            }
            insize_00 = uVar17;
            bVar5 = true;
            bVar19 = false;
            if (!bVar18) {
LAB_001b42a1:
              if (((state->decoder).ignore_crc != 0 || bVar4) ||
                 (uVar8 = lodepng_chunk_check_crc((uchar *)chunk), uVar8 == 0)) {
                iVar9 = 0;
                if (bVar5) {
                  uVar8 = *chunk;
                  chunk = (uint *)((long)chunk +
                                  (ulong)((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 |
                                           (uVar8 & 0xff00) << 8 | uVar8 << 0x18) + 0xc));
                }
              }
              else {
                state->error = 0x39;
                bVar4 = false;
                iVar9 = 3;
              }
            }
          }
        }
LAB_001b41bb:
      } while (iVar9 == 0);
      w = local_50;
      local_78 = (uchar *)0x0;
      sStack_70 = 0;
      local_68 = 0;
      uVar8 = *local_50;
      if ((state->info_png).interlace_method == 0) {
        uVar13 = *h;
        sVar12 = lodepng_get_raw_size_idat(uVar8,uVar13,pLVar2);
        uVar16 = sVar12 + uVar13;
      }
      else {
        uVar13 = *h;
        uVar14 = uVar13 + 7 >> 3;
        sVar12 = lodepng_get_raw_size_idat(uVar8 + 7 >> 3,uVar14,pLVar2);
        lVar15 = sVar12 + uVar14;
        if (4 < uVar8) {
          sVar12 = lodepng_get_raw_size_idat(uVar8 + 3 >> 3,uVar14,pLVar2);
          lVar15 = lVar15 + (ulong)uVar14 + sVar12;
        }
        uVar14 = uVar13 + 3 >> 3;
        sVar12 = lodepng_get_raw_size_idat(uVar8 + 3 >> 2,uVar14,pLVar2);
        lVar15 = uVar14 + sVar12 + lVar15;
        if (2 < uVar8) {
          uVar14 = uVar13 + 3 >> 2;
          sVar12 = lodepng_get_raw_size_idat(uVar8 + 1 >> 2,uVar14,pLVar2);
          lVar15 = lVar15 + uVar14 + sVar12;
        }
        uVar14 = uVar13 + 1 >> 2;
        sVar12 = lodepng_get_raw_size_idat(uVar8 + 1 >> 1,uVar14,pLVar2);
        lVar15 = uVar14 + sVar12 + lVar15;
        if (1 < uVar8) {
          uVar14 = uVar13 + 1 >> 1;
          sVar12 = lodepng_get_raw_size_idat(uVar8 >> 1,uVar14,pLVar2);
          lVar15 = lVar15 + uVar14 + sVar12;
        }
        w = local_50;
        sVar12 = lodepng_get_raw_size_idat(uVar8,uVar13 >> 1,pLVar2);
        uVar16 = sVar12 + (uVar13 >> 1) + lVar15;
      }
      puVar11 = local_78;
      uVar17 = local_68;
      if ((state->error == 0) && (local_68 < uVar16)) {
        uVar17 = uVar16 * 3 >> 1;
        if (local_68 * 2 < uVar16) {
          uVar17 = uVar16;
        }
        puVar11 = (uchar *)realloc(local_78,uVar17);
        if (puVar11 == (uchar *)0x0) {
          state->error = 0x53;
          puVar11 = local_78;
          uVar17 = local_68;
        }
      }
      local_68 = uVar17;
      local_78 = puVar11;
      if (state->error == 0) {
        p_Var3 = (state->decoder).zlibsettings.custom_zlib;
        if (p_Var3 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                       *)0x0) {
          uVar8 = lodepng_zlib_decompress
                            (&local_78,&sStack_70,local_a8,insize_00,&zlibsettings->zlibsettings);
        }
        else {
          uVar8 = (*p_Var3)(&local_78,&sStack_70,local_a8,insize_00,&zlibsettings->zlibsettings);
        }
        state->error = uVar8;
        uVar13 = 0x5b;
        if (sStack_70 == uVar16) {
          uVar13 = uVar8;
        }
        if (uVar8 != 0) {
          uVar13 = uVar8;
        }
        state->error = uVar13;
      }
      free(local_a8);
      if (state->error == 0) {
        sVar12 = lodepng_get_raw_size(*w,*h,pLVar2);
        if (sVar12 == 0) {
          puVar11 = (uchar *)0x0;
          bVar19 = false;
        }
        else {
          puVar11 = (uchar *)malloc(sVar12);
          bVar19 = puVar11 == (uchar *)0x0;
        }
        ppuVar6 = local_48;
        if (sVar12 == 0 || bVar19) {
          if (bVar19) {
            state->error = 0x53;
          }
        }
        else {
          memset(puVar11,0,sVar12);
        }
        if (state->error == 0) {
          uVar8 = postProcessScanlines(puVar11,local_78,*w,*h,info);
          state->error = uVar8;
        }
        *ppuVar6 = puVar11;
      }
      sStack_70 = 0;
      local_68 = 0;
      free(local_78);
      local_78 = (uchar *)0x0;
    }
    else {
      state->error = 0x5c;
    }
  }
  if (state->error != 0) {
    return state->error;
  }
  uVar8 = (state->decoder).color_convert;
  if (uVar8 != 0) {
    pLVar2 = &state->info_raw;
    b = &(state->info_png).color;
    iVar9 = lodepng_color_mode_equal(pLVar2,b);
    if (iVar9 == 0) {
      puVar11 = *local_48;
      if (((pLVar2->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      uVar8 = *w;
      uVar13 = *h;
      sVar12 = lodepng_get_raw_size(uVar8,uVar13,pLVar2);
      out_00 = (uchar *)malloc(sVar12);
      *local_48 = out_00;
      if (out_00 == (uchar *)0x0) {
        uVar8 = 0x53;
      }
      else {
        lodepng_convert(out_00,puVar11,pLVar2,b,uVar8,uVar13);
        uVar8 = 0;
      }
      state->error = uVar8;
      free(puVar11);
      goto LAB_001b48d5;
    }
    if (uVar8 != 0) goto LAB_001b48d5;
  }
  uVar8 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
  state->error = uVar8;
  if (uVar8 != 0) {
    return uVar8;
  }
LAB_001b48d5:
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
                        LodePNGState* state,
                        const unsigned char* in, size_t insize)
{
  *out = 0;
  decodeGeneric(out, w, h, state, in, insize);
  if(state->error) return state->error;
  if(!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
  {
    /*same color type, no copying or converting of data needed*/
    /*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
    the raw image has to the end user*/
    if(!state->decoder.color_convert)
    {
      state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
      if(state->error) return state->error;
    }
  }
  else
  {
    /*color conversion needed; sort of copy of the data*/
    unsigned char* data = *out;
    size_t outsize;

    /*TODO: check if this works according to the statement in the documentation: "The converter can convert
    from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
    if(!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
       && !(state->info_raw.bitdepth == 8))
    {
      return 56; /*unsupported color mode conversion*/
    }

    outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
    *out = (unsigned char*)lodepng_malloc(outsize);
    if(!(*out))
    {
      state->error = 83; /*alloc fail*/
    }
    else state->error = lodepng_convert(*out, data, &state->info_raw,
                                        &state->info_png.color, *w, *h);
    lodepng_free(data);
  }
  return state->error;
}